

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::draw
          (Fl_PostScript_Graphics_Driver *this,Fl_RGB_Image *rgb,int XP,int YP,int WP,int HP,int cx,
          int cy)

{
  uint w;
  uint h;
  uchar *data;
  int iVar1;
  
  data = rgb->array;
  w = (rgb->super_Fl_Image).w_;
  h = (rgb->super_Fl_Image).h_;
  this->mask = (uchar *)0x0;
  if ((2 < this->lang_level_) &&
     (iVar1 = alpha_mask(this,data,w,h,(rgb->super_Fl_Image).d_,(rgb->super_Fl_Image).ld_),
     iVar1 != 0)) {
    return;
  }
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2a])
            (this,(ulong)(uint)XP,(ulong)(uint)YP,(ulong)(uint)WP,HP);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2f])
            (this,data,(ulong)(uint)(cx + XP),(ulong)(uint)(cy + YP),(ulong)w,(ulong)h,
             (ulong)(uint)(rgb->super_Fl_Image).d_,(ulong)(uint)(rgb->super_Fl_Image).ld_);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])(this);
  if (this->mask != (uchar *)0x0) {
    operator_delete__(this->mask);
  }
  this->mask = (uchar *)0x0;
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw(Fl_RGB_Image * rgb,int XP, int YP, int WP, int HP, int cx, int cy){
  const uchar  * di = rgb->array;
  int w = rgb->w();
  int h = rgb->h();
  mask=0;
  if (lang_level_>2) //when not true, not making alphamask, mixing colors instead...
  if (alpha_mask(di, w, h, rgb->d(),rgb->ld())) return; //everthing masked, no need for painting!
  push_clip(XP, YP, WP, HP);
  draw_image(di, XP + cx, YP + cy, w, h, rgb->d(), rgb->ld());
  pop_clip();
  delete[]mask;
  mask=0;
}